

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::IsAllOriginalData(Codec *this)

{
  uint uVar1;
  void *__s;
  long in_RDI;
  uint32_t id;
  uint16_t row_i;
  uint seen_rows;
  PeelRow *row;
  uint8_t *copied_rows;
  ushort local_1e;
  uint local_1c;
  uint *local_18;
  
  __s = *(void **)(in_RDI + 0x20);
  memset(__s,0,(ulong)*(ushort *)(in_RDI + 4));
  local_18 = *(uint **)(in_RDI + 0x60);
  local_1c = 0;
  for (local_1e = 0; local_1e < *(ushort *)(in_RDI + 0x16); local_1e = local_1e + 1) {
    uVar1 = *local_18;
    if ((uVar1 < *(ushort *)(in_RDI + 4)) && (*(char *)((long)__s + (ulong)uVar1) == '\0')) {
      *(undefined1 *)((long)__s + (ulong)uVar1) = 1;
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 6;
  }
  return *(ushort *)(in_RDI + 4) <= local_1c;
}

Assistant:

bool Codec::IsAllOriginalData()
{
    // Use some of the recovery blocks memory
    uint8_t * GF256_RESTRICT copied_rows = reinterpret_cast<uint8_t*>(_recovery_blocks);

    // Zero an array to store whether or not each row id needs to be regenerated
    memset(copied_rows, 0, _block_count);

    const PeelRow * GF256_RESTRICT row = _peel_rows;
    unsigned seen_rows = 0;

    // Copy any original message rows that were received:
    for (uint16_t row_i = 0; row_i < _row_count; ++row_i, ++row)
    {
        const uint32_t id = row->RecoveryId;

        // If the row identifier indicates it is part of the original message data:
        // If not already marked copied:
        if (id < _block_count &&
            !copied_rows[id])
        {
            copied_rows[id] = 1;
            ++seen_rows;
        }
    }

    // If all rows were seen, return true
    return seen_rows >= _block_count;
}